

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O1

int16_t ** __thiscall webrtc::AudioBuffer::split_channels(AudioBuffer *this,Band band)

{
  IFChannelBuffer *this_00;
  ChannelBuffer<short> *t;
  ChannelBuffer<short> *this_01;
  short **ppsVar1;
  ulong band_00;
  
  band_00 = (ulong)band;
  this->mixed_low_pass_valid_ = false;
  this_00 = (this->split_data_)._M_t.
            super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
            ._M_t.
            super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
            .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl;
  if (this_00 == (IFChannelBuffer *)0x0) {
    if (band != kBand0To8kHz) {
      return (int16_t **)0x0;
    }
    this_01 = IFChannelBuffer::ibuf
                        ((this->data_)._M_t.
                         super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
                         .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl);
    band_00 = 0;
  }
  else {
    this_01 = IFChannelBuffer::ibuf(this_00);
  }
  ppsVar1 = ChannelBuffer<short>::channels(this_01,band_00);
  return ppsVar1;
}

Assistant:

int16_t* const* AudioBuffer::split_channels(Band band) {
  mixed_low_pass_valid_ = false;
  if (split_data_.get()) {
    return split_data_->ibuf()->channels(band);
  } else {
    return band == kBand0To8kHz ? data_->ibuf()->channels() : nullptr;
  }
}